

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scgi_api.cpp
# Opt level: O0

void __thiscall
cppcms::impl::cgi::scgi::on_headers_chunk_read(scgi *this,error_code *e,size_t param_3,handler *h)

{
  bool bVar1;
  reference pvVar2;
  string_pool *psVar3;
  size_t sVar4;
  char *__s;
  error_code *in_RCX;
  error_code *in_RSI;
  callback<void_(const_std::error_code_&)> *in_RDI;
  char *value;
  char *key;
  char *p;
  char *in_stack_00000058;
  string_map *in_stack_00000060;
  vector<char,_std::allocator<char>_> *in_stack_ffffffffffffff80;
  char *in_stack_ffffffffffffff88;
  string_pool *this_00;
  error_code *in_stack_ffffffffffffff98;
  string_pool *local_38;
  error_code local_30;
  error_code *local_20;
  
  local_20 = in_RCX;
  bVar1 = std::error_code::operator_cast_to_bool(in_RSI);
  if (bVar1) {
    booster::callback<void_(const_std::error_code_&)>::operator()(in_RDI,in_stack_ffffffffffffff98);
  }
  else {
    pvVar2 = std::vector<char,_std::allocator<char>_>::back(in_stack_ffffffffffffff80);
    if (*pvVar2 == ',') {
      local_38 = (string_pool *)
                 std::vector<char,_std::allocator<char>_>::operator[]
                           ((vector<char,_std::allocator<char>_> *)(in_RDI + 0x2e),
                            (size_type)
                            ((long)&((in_RDI[0x22].call_ptr.p_)->super_refcounted)._vptr_refcounted
                            + 1));
      while (this_00 = local_38,
            psVar3 = (string_pool *)
                     std::vector<char,_std::allocator<char>_>::back(in_stack_ffffffffffffff80),
            this_00 < psVar3) {
        string_pool::add(this_00,in_stack_ffffffffffffff88);
        sVar4 = strlen((char *)local_38);
        __s = (char *)((long)&local_38->page_size_ + sVar4 + 1);
        in_stack_ffffffffffffff88 = __s;
        pvVar2 = std::vector<char,_std::allocator<char>_>::back(in_stack_ffffffffffffff80);
        if (pvVar2 <= in_stack_ffffffffffffff88) break;
        string_pool::add(this_00,in_stack_ffffffffffffff88);
        sVar4 = strlen(__s);
        local_38 = (string_pool *)(__s + sVar4 + 1);
        string_map::add(in_stack_00000060,in_stack_00000058,p);
      }
      std::vector<char,_std::allocator<char>_>::clear
                ((vector<char,_std::allocator<char>_> *)0x495a28);
      std::error_code::error_code(local_20);
      booster::callback<void_(const_std::error_code_&)>::operator()
                (in_RDI,in_stack_ffffffffffffff98);
    }
    else {
      pvVar2 = std::vector<char,_std::allocator<char>_>::back(in_stack_ffffffffffffff80);
      *pvVar2 = '\0';
      std::error_code::error_code(&local_30,1,(error_category *)&cppcms_category);
      booster::callback<void_(const_std::error_code_&)>::operator()(in_RDI,local_20);
    }
  }
  return;
}

Assistant:

void on_headers_chunk_read(booster::system::error_code const &e,size_t ,handler const &h)
		{
			if(e) { h(e); return; }
			if(buffer_.back()!=',') {
				buffer_.back() = 0;
				// make sure it is NUL terminated
				h(booster::system::error_code(errc::protocol_violation,cppcms_category));
				return;
			}

			char const *p=&buffer_[sep_ + 1];
			while(p < &buffer_.back()) {
				char *key=pool_.add(p);
				p+=strlen(p)+1;
				if(p>=&buffer_.back())
					break;
				char *value=pool_.add(p);
				p+=strlen(p)+1;
				env_.add(key,value);
			}
			buffer_.clear();

			h(booster::system::error_code());
		}